

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkTimePrepare(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  float *pfVar2;
  Abc_Obj_t *pAVar3;
  Abc_ManTime_t *pAVar4;
  int iVar5;
  int iVar6;
  
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_ManTimeExpand(pNtk->pManTime,pNtk->vObjs->nSize,0);
    ppvVar1 = pNtk->pManTime->vArrs->pArray;
    for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar6);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        iVar5 = (pAVar3->vFanins).nSize;
        if (iVar5 != 0) {
          iVar5 = -1000000000;
        }
        pfVar2 = (float *)ppvVar1[pAVar3->Id];
        *pfVar2 = (float)iVar5;
        pfVar2[1] = (float)iVar5;
      }
    }
    for (iVar6 = 0; iVar6 < pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkCo(pNtk,iVar6);
      *(undefined8 *)ppvVar1[pAVar3->Id] = 0xce6e6b28ce6e6b28;
    }
    ppvVar1 = pNtk->pManTime->vReqs->pArray;
    for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar6);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        builtin_strncpy((char *)ppvVar1[pAVar3->Id],"(knN(knN",8);
      }
    }
    for (iVar6 = 0; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkCi(pNtk,iVar6);
      builtin_strncpy((char *)ppvVar1[pAVar3->Id],"(knN(knN",8);
    }
    return;
  }
  pAVar4 = Abc_ManTimeStart(pNtk);
  pNtk->pManTime = pAVar4;
  Abc_NtkTimeInitialize(pNtk,(Abc_Ntk_t *)0x0);
  return;
}

Assistant:

void Abc_NtkTimePrepare( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes, * pTime;
    int i;
    // if there is no timing manager, allocate and initialize
    if ( pNtk->pManTime == NULL )
    {
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
        Abc_NtkTimeInitialize( pNtk, NULL );
        return;
    }
    // if timing manager is given, expand it if necessary
    Abc_ManTimeExpand( pNtk->pManTime, Abc_NtkObjNumMax(pNtk), 0 );
    // clean arrivals except for PIs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = Abc_ObjFaninNum(pObj) ? -ABC_INFINITY : 0; // set contant node arrivals to zero
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = -ABC_INFINITY;
    }
    // clean required except for POs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = ABC_INFINITY;
    }
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall = pTime->Rise = ABC_INFINITY;
    }
}